

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

void start_pass_fdctmgr(j_compress_ptr cinfo)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  undefined8 uVar5;
  long *in_RDI;
  int col;
  int row;
  float *fdtbl;
  DCTELEM *dtbl;
  JQUANT_TBL *qtbl;
  int method;
  jpeg_component_info *compptr;
  int i;
  int qtblno;
  int ci;
  my_fdct_ptr fdct;
  int local_50;
  int local_4c;
  int local_2c;
  long local_28;
  int local_1c;
  int local_14;
  
  lVar1 = in_RDI[0x45];
  local_2c = 0;
  local_14 = 0;
  local_28 = in_RDI[0xd];
  for (; local_14 < *(int *)((long)in_RDI + 0x5c); local_14 = local_14 + 1) {
    iVar4 = *(int *)(local_28 + 0x24) * 0x100 + *(int *)(local_28 + 0x28);
    if (iVar4 == 0x101) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_1x1;
      local_2c = 0;
    }
    else if (iVar4 == 0x102) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_1x2;
      local_2c = 0;
    }
    else if (iVar4 == 0x201) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_2x1;
      local_2c = 0;
    }
    else if (iVar4 == 0x202) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_2x2;
      local_2c = 0;
    }
    else if (iVar4 == 0x204) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_2x4;
      local_2c = 0;
    }
    else if (iVar4 == 0x303) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_3x3;
      local_2c = 0;
    }
    else if (iVar4 == 0x306) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_3x6;
      local_2c = 0;
    }
    else if (iVar4 == 0x402) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_4x2;
      local_2c = 0;
    }
    else if (iVar4 == 0x404) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_4x4;
      local_2c = 0;
    }
    else if (iVar4 == 0x408) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_4x8;
      local_2c = 0;
    }
    else if (iVar4 == 0x505) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_5x5;
      local_2c = 0;
    }
    else if (iVar4 == 0x50a) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_5x10;
      local_2c = 0;
    }
    else if (iVar4 == 0x603) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_6x3;
      local_2c = 0;
    }
    else if (iVar4 == 0x606) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_6x6;
      local_2c = 0;
    }
    else if (iVar4 == 0x60c) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_6x12;
      local_2c = 0;
    }
    else if (iVar4 == 0x707) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_7x7;
      local_2c = 0;
    }
    else if (iVar4 == 0x70e) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_7x14;
      local_2c = 0;
    }
    else if (iVar4 == 0x804) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_8x4;
      local_2c = 0;
    }
    else if (iVar4 == 0x808) {
      iVar4 = (int)in_RDI[0x27];
      if (iVar4 == 0) {
        *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_islow;
        local_2c = 0;
      }
      else if (iVar4 == 1) {
        *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_ifast;
        local_2c = 1;
      }
      else if (iVar4 == 2) {
        *(code **)(lVar1 + 200 + (long)local_14 * 8) = jpeg_fdct_float;
        local_2c = 2;
      }
      else {
        *(undefined4 *)(*in_RDI + 0x28) = 0x31;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
    else if (iVar4 == 0x810) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_8x16;
      local_2c = 0;
    }
    else if (iVar4 == 0x909) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_9x9;
      local_2c = 0;
    }
    else if (iVar4 == 0xa05) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_10x5;
      local_2c = 0;
    }
    else if (iVar4 == 0xa0a) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_10x10;
      local_2c = 0;
    }
    else if (iVar4 == 0xb0b) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_11x11;
      local_2c = 0;
    }
    else if (iVar4 == 0xc06) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_12x6;
      local_2c = 0;
    }
    else if (iVar4 == 0xc0c) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_12x12;
      local_2c = 0;
    }
    else if (iVar4 == 0xd0d) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_13x13;
      local_2c = 0;
    }
    else if (iVar4 == 0xe07) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_14x7;
      local_2c = 0;
    }
    else if (iVar4 == 0xe0e) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_14x14;
      local_2c = 0;
    }
    else if (iVar4 == 0xf0f) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_15x15;
      local_2c = 0;
    }
    else if (iVar4 == 0x1008) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_16x8;
      local_2c = 0;
    }
    else if (iVar4 == 0x1010) {
      *(code **)(lVar1 + 0x58 + (long)local_14 * 8) = jpeg_fdct_16x16;
      local_2c = 0;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 7;
      *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)(local_28 + 0x24);
      *(undefined4 *)(*in_RDI + 0x30) = *(undefined4 *)(local_28 + 0x28);
      (**(code **)*in_RDI)(in_RDI);
    }
    iVar4 = *(int *)(local_28 + 0x10);
    if (((iVar4 < 0) || (3 < iVar4)) || (in_RDI[(long)iVar4 + 0xe] == 0)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x36;
      *(int *)(*in_RDI + 0x2c) = iVar4;
      (**(code **)*in_RDI)(in_RDI);
    }
    lVar2 = in_RDI[(long)iVar4 + 0xe];
    if (local_2c == 0) {
      if (*(long *)(lVar1 + 0xa8 + (long)iVar4 * 8) == 0) {
        uVar5 = (**(code **)in_RDI[1])(in_RDI,1,0x100);
        *(undefined8 *)(lVar1 + 0xa8 + (long)iVar4 * 8) = uVar5;
      }
      lVar3 = *(long *)(lVar1 + 0xa8 + (long)iVar4 * 8);
      for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
        *(uint *)(lVar3 + (long)local_1c * 4) = (uint)*(ushort *)(lVar2 + (long)local_1c * 2) << 3;
      }
      *(code **)(lVar1 + 8 + (long)local_14 * 8) = forward_DCT;
    }
    else if (local_2c == 1) {
      if (*(long *)(lVar1 + 0xa8 + (long)iVar4 * 8) == 0) {
        uVar5 = (**(code **)in_RDI[1])(in_RDI,1,0x100);
        *(undefined8 *)(lVar1 + 0xa8 + (long)iVar4 * 8) = uVar5;
      }
      lVar3 = *(long *)(lVar1 + 0xa8 + (long)iVar4 * 8);
      for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
        *(int *)(lVar3 + (long)local_1c * 4) =
             (int)((long)((ulong)*(ushort *)(lVar2 + (long)local_1c * 2) *
                          (long)start_pass_fdctmgr::aanscales[local_1c] + 0x400) >> 0xb);
      }
      *(code **)(lVar1 + 8 + (long)local_14 * 8) = forward_DCT;
    }
    else if (local_2c == 2) {
      if (*(long *)(lVar1 + 0x118 + (long)iVar4 * 8) == 0) {
        uVar5 = (**(code **)in_RDI[1])(in_RDI,1,0x100);
        *(undefined8 *)(lVar1 + 0x118 + (long)iVar4 * 8) = uVar5;
      }
      lVar3 = *(long *)(lVar1 + 0x118 + (long)iVar4 * 8);
      local_1c = 0;
      for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
        for (local_50 = 0; local_50 < 8; local_50 = local_50 + 1) {
          *(float *)(lVar3 + (long)local_1c * 4) =
               (float)(1.0 / ((double)*(ushort *)(lVar2 + (long)local_1c * 2) *
                              start_pass_fdctmgr::aanscalefactor[local_4c] *
                              start_pass_fdctmgr::aanscalefactor[local_50] * 8.0));
          local_1c = local_1c + 1;
        }
      }
      *(code **)(lVar1 + 8 + (long)local_14 * 8) = forward_DCT_float;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x31;
      (**(code **)*in_RDI)(in_RDI);
    }
    local_28 = local_28 + 0x60;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_fdctmgr (j_compress_ptr cinfo)
{
  my_fdct_ptr fdct = (my_fdct_ptr) cinfo->fdct;
  int ci, qtblno, i;
  jpeg_component_info *compptr;
  int method = 0;
  JQUANT_TBL * qtbl;
  DCTELEM * dtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Select the proper DCT routine for this component's scaling */
    switch ((compptr->DCT_h_scaled_size << 8) + compptr->DCT_v_scaled_size) {
#ifdef DCT_SCALING_SUPPORTED
    case ((1 << 8) + 1):
      fdct->do_dct[ci] = jpeg_fdct_1x1;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((2 << 8) + 2):
      fdct->do_dct[ci] = jpeg_fdct_2x2;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((3 << 8) + 3):
      fdct->do_dct[ci] = jpeg_fdct_3x3;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((4 << 8) + 4):
      fdct->do_dct[ci] = jpeg_fdct_4x4;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((5 << 8) + 5):
      fdct->do_dct[ci] = jpeg_fdct_5x5;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((6 << 8) + 6):
      fdct->do_dct[ci] = jpeg_fdct_6x6;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((7 << 8) + 7):
      fdct->do_dct[ci] = jpeg_fdct_7x7;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((9 << 8) + 9):
      fdct->do_dct[ci] = jpeg_fdct_9x9;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((10 << 8) + 10):
      fdct->do_dct[ci] = jpeg_fdct_10x10;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((11 << 8) + 11):
      fdct->do_dct[ci] = jpeg_fdct_11x11;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((12 << 8) + 12):
      fdct->do_dct[ci] = jpeg_fdct_12x12;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((13 << 8) + 13):
      fdct->do_dct[ci] = jpeg_fdct_13x13;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((14 << 8) + 14):
      fdct->do_dct[ci] = jpeg_fdct_14x14;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((15 << 8) + 15):
      fdct->do_dct[ci] = jpeg_fdct_15x15;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((16 << 8) + 16):
      fdct->do_dct[ci] = jpeg_fdct_16x16;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((16 << 8) + 8):
      fdct->do_dct[ci] = jpeg_fdct_16x8;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((14 << 8) + 7):
      fdct->do_dct[ci] = jpeg_fdct_14x7;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((12 << 8) + 6):
      fdct->do_dct[ci] = jpeg_fdct_12x6;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((10 << 8) + 5):
      fdct->do_dct[ci] = jpeg_fdct_10x5;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((8 << 8) + 4):
      fdct->do_dct[ci] = jpeg_fdct_8x4;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((6 << 8) + 3):
      fdct->do_dct[ci] = jpeg_fdct_6x3;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((4 << 8) + 2):
      fdct->do_dct[ci] = jpeg_fdct_4x2;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((2 << 8) + 1):
      fdct->do_dct[ci] = jpeg_fdct_2x1;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((8 << 8) + 16):
      fdct->do_dct[ci] = jpeg_fdct_8x16;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((7 << 8) + 14):
      fdct->do_dct[ci] = jpeg_fdct_7x14;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((6 << 8) + 12):
      fdct->do_dct[ci] = jpeg_fdct_6x12;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((5 << 8) + 10):
      fdct->do_dct[ci] = jpeg_fdct_5x10;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((4 << 8) + 8):
      fdct->do_dct[ci] = jpeg_fdct_4x8;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((3 << 8) + 6):
      fdct->do_dct[ci] = jpeg_fdct_3x6;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((2 << 8) + 4):
      fdct->do_dct[ci] = jpeg_fdct_2x4;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((1 << 8) + 2):
      fdct->do_dct[ci] = jpeg_fdct_1x2;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
#endif
    case ((DCTSIZE << 8) + DCTSIZE):
      switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
      case JDCT_ISLOW:
	fdct->do_dct[ci] = jpeg_fdct_islow;
	method = JDCT_ISLOW;
	break;
#endif
#ifdef DCT_IFAST_SUPPORTED
      case JDCT_IFAST:
	fdct->do_dct[ci] = jpeg_fdct_ifast;
	method = JDCT_IFAST;
	break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
      case JDCT_FLOAT:
	fdct->do_float_dct[ci] = jpeg_fdct_float;
	method = JDCT_FLOAT;
	break;
#endif
      default:
	ERREXIT(cinfo, JERR_NOT_COMPILED);
	break;
      }
      break;
    default:
      ERREXIT2(cinfo, JERR_BAD_DCTSIZE,
	       compptr->DCT_h_scaled_size, compptr->DCT_v_scaled_size);
      break;
    }
    qtblno = compptr->quant_tbl_no;
    /* Make sure specified quantization table is present */
    if (qtblno < 0 || qtblno >= NUM_QUANT_TBLS ||
	cinfo->quant_tbl_ptrs[qtblno] == NULL)
      ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, qtblno);
    qtbl = cinfo->quant_tbl_ptrs[qtblno];
    /* Compute divisors for this quant table */
    /* We may do this more than once for same table, but it's not a big deal */
    switch (method) {
#ifdef PROVIDE_ISLOW_TABLES
    case JDCT_ISLOW:
      /* For LL&M IDCT method, divisors are equal to raw quantization
       * coefficients multiplied by 8 (to counteract scaling).
       */
      if (fdct->divisors[qtblno] == NULL) {
	fdct->divisors[qtblno] = (DCTELEM *)
	  (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				      DCTSIZE2 * SIZEOF(DCTELEM));
      }
      dtbl = fdct->divisors[qtblno];
      for (i = 0; i < DCTSIZE2; i++) {
	dtbl[i] = ((DCTELEM) qtbl->quantval[i]) << 3;
      }
      fdct->pub.forward_DCT[ci] = forward_DCT;
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
	/* For AA&N IDCT method, divisors are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 8.
	 */
#define CONST_BITS 14
	static const INT16 aanscales[DCTSIZE2] = {
	  /* precomputed values scaled up by 14 bits */
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
	  21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
	  19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
	   8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
	   4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
	};
	SHIFT_TEMPS

	if (fdct->divisors[qtblno] == NULL) {
	  fdct->divisors[qtblno] = (DCTELEM *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					DCTSIZE2 * SIZEOF(DCTELEM));
	}
	dtbl = fdct->divisors[qtblno];
	for (i = 0; i < DCTSIZE2; i++) {
	  dtbl[i] = (DCTELEM)
	    DESCALE(MULTIPLY16V16((INT32) qtbl->quantval[i],
				  (INT32) aanscales[i]),
		    CONST_BITS-3);
	}
      }
      fdct->pub.forward_DCT[ci] = forward_DCT;
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
	/* For float AA&N IDCT method, divisors are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 8.
	 * What's actually stored is 1/divisor so that the inner loop can
	 * use a multiplication rather than a division.
	 */
	FAST_FLOAT * fdtbl;
	int row, col;
	static const double aanscalefactor[DCTSIZE] = {
	  1.0, 1.387039845, 1.306562965, 1.175875602,
	  1.0, 0.785694958, 0.541196100, 0.275899379
	};

	if (fdct->float_divisors[qtblno] == NULL) {
	  fdct->float_divisors[qtblno] = (FAST_FLOAT *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					DCTSIZE2 * SIZEOF(FAST_FLOAT));
	}
	fdtbl = fdct->float_divisors[qtblno];
	i = 0;
	for (row = 0; row < DCTSIZE; row++) {
	  for (col = 0; col < DCTSIZE; col++) {
	    fdtbl[i] = (FAST_FLOAT)
	      (1.0 / (((double) qtbl->quantval[i] *
		       aanscalefactor[row] * aanscalefactor[col] * 8.0)));
	    i++;
	  }
	}
      }
      fdct->pub.forward_DCT[ci] = forward_DCT_float;
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}